

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec3.cpp
# Opt level: O0

Vec3 cross(Vec3 *v1,Vec3 *v2)

{
  float e1;
  float *in_RDX;
  float *in_RSI;
  Vec3 *in_RDI;
  undefined8 extraout_XMM0_Qa;
  Vec3 VVar1;
  
  e1 = -(*in_RSI * in_RDX[2] + -(in_RSI[2] * *in_RDX));
  Vec3::Vec3(in_RDI,in_RSI[1] * in_RDX[2] + -(in_RSI[2] * in_RDX[1]),e1,
             *in_RSI * in_RDX[1] + -(in_RSI[1] * *in_RDX));
  VVar1.e[2] = e1;
  VVar1.e[0] = (float)(int)extraout_XMM0_Qa;
  VVar1.e[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vec3)VVar1.e;
}

Assistant:

Vec3
cross(const Vec3 &v1, const Vec3 &v2) {
    return Vec3( (v1.e[1]*v2.e[2] - v1.e[2]*v2.e[1]),
                (-(v1.e[0]*v2.e[2] - v1.e[2]*v2.e[0])),
                (v1.e[0]*v2.e[1] - v1.e[1]*v2.e[0]));
}